

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

string * cmCTest::DecodeURL(string *__return_storage_ptr__,string *in)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char buf [3];
  char local_3b;
  char local_3a;
  undefined1 local_39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar4 = (in->_M_dataplus)._M_p;
  do {
    if (*pcVar4 == '%') {
      cVar1 = pcVar4[1];
      iVar3 = isxdigit((int)cVar1);
      if (iVar3 == 0) goto LAB_00250b5c;
      cVar2 = pcVar4[2];
      iVar3 = isxdigit((int)cVar2);
      if (iVar3 == 0) goto LAB_00250b5c;
      local_39 = 0;
      local_3b = cVar1;
      local_3a = cVar2;
      strtoul(&local_3b,(char **)0x0,0x10);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
      pcVar4 = pcVar4 + 2;
    }
    else {
      if (*pcVar4 == '\0') {
        return __return_storage_ptr__;
      }
LAB_00250b5c:
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

std::string cmCTest::DecodeURL(const std::string& in)
{
  std::string out;
  for(const char* c = in.c_str(); *c; ++c)
    {
    if(*c == '%' && isxdigit(*(c+1)) && isxdigit(*(c+2)))
      {
      char buf[3] = {*(c+1), *(c+2), 0};
      out.append(1, char(strtoul(buf, 0, 16)));
      c += 2;
      }
    else
      {
      out.append(1, *c);
      }
    }
  return out;
}